

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::AllocateFunctionAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  bool bVar1;
  ScriptContext *this;
  JsRTVarsArgumentAction_InternalUse<1UL> *argAction;
  TTDVar origVar;
  RecyclableObject *this_00;
  ScriptContext *pSVar2;
  JavascriptLibrary *pJVar3;
  JavascriptExternalFunction *result;
  Var res;
  RecyclableObject *__obj;
  JavascriptString *name;
  Var metadata;
  JsRTSingleVarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  this = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (this == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)40>
                        (evt);
  origVar = GetVarItem_0<1ul>(argAction);
  name = (JavascriptString *)InflateVarInReplay(executeContext,origVar);
  if (name == (JavascriptString *)0x0) {
    pJVar3 = Js::ScriptContext::GetLibrary(this);
    __obj = &Js::JavascriptLibrary::GetEmptyString(pJVar3)->super_RecyclableObject;
  }
  else {
    if (name == (JavascriptString *)0x0) {
      return;
    }
    bVar1 = Js::VarIs<Js::RecyclableObject>(name);
    if (bVar1) {
      this_00 = Js::VarTo<Js::RecyclableObject>(name);
      pSVar2 = Js::RecyclableObject::GetScriptContext(this_00);
      if (pSVar2 != this) {
        name = (JavascriptString *)Js::CrossSite::MarshalVar(this,this_00,false);
      }
    }
    __obj = &Js::JavascriptConversion::ToString(name,this)->super_RecyclableObject;
  }
  pJVar3 = Js::ScriptContext::GetLibrary(this);
  result = Js::JavascriptLibrary::CreateStdCallExternalFunction
                     (pJVar3,Js::JavascriptExternalFunction::TTDReplayDummyExternalMethod,__obj,
                      (void *)0x0);
  JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)40>
            (executeContext,evt,result);
  return;
}

Assistant:

void AllocateFunctionAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::AllocateFunctionActionTag>(evt);

            Js::Var metadata = InflateVarInReplay(executeContext, GetVarItem_0(action));

            Js::JavascriptString* name = nullptr;
            if(metadata != nullptr)
            {
                TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(metadata, ctx);
                name = Js::JavascriptConversion::ToString(metadata, ctx);
            }
            else
            {
                name = ctx->GetLibrary()->GetEmptyString();
            }

            Js::Var res = ctx->GetLibrary()->CreateStdCallExternalFunction(&Js::JavascriptExternalFunction::TTDReplayDummyExternalMethod, name, nullptr);

            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::AllocateFunctionActionTag>(executeContext, evt, res);
        }